

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O3

void __thiscall
Diligent::VariableSizeAllocationsManager::Free
          (VariableSizeAllocationsManager *this,OffsetType Offset,OffsetType Size)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr *pp_Var3;
  const_iterator __position;
  const_iterator cVar4;
  _Base_ptr in_RCX;
  _Base_ptr p_Var5;
  OffsetType Size_00;
  _Base_ptr p_Var6;
  string msg;
  string local_58;
  _Base_ptr local_38;
  
  if ((Offset == 0xffffffffffffffff) || (this->m_MaxSize < Size + Offset)) {
    FormatString<char[26],char[66]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Offset != Allocation::InvalidOffset && Offset + Size <= m_MaxSize",
               (char (*) [66])in_RCX);
    in_RCX = (_Base_ptr)0x118;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var6 = (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = p_Var6;
  cVar4._M_node = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      p_Var2 = p_Var5 + 1;
      if (Offset < *(ulong *)p_Var2) {
        cVar4._M_node = p_Var5;
      }
      pp_Var3 = &p_Var5->_M_left;
      in_RCX = &p_Var1->_M_header;
      p_Var5 = pp_Var3[*(ulong *)p_Var2 <= Offset];
    } while (pp_Var3[*(ulong *)p_Var2 <= Offset] != (_Base_ptr)0x0);
    do {
      if (*(ulong *)(p_Var6 + 1) >= Offset) {
        in_RCX = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < Offset];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (in_RCX != cVar4._M_node) {
      FormatString<char[26],char[22]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"LowBnd == NextBlockIt",(char (*) [22])in_RCX);
      in_RCX = (_Base_ptr)0x122;
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x122);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if (((_Rb_tree_header *)cVar4._M_node != p_Var1) &&
       (*(ulong *)(cVar4._M_node + 1) < Size + Offset)) {
      FormatString<char[26],char[81]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "NextBlockIt == m_FreeBlocksByOffset.end() || Offset + Size <= NextBlockIt->first",
                 (char (*) [81])in_RCX);
      in_RCX = (_Base_ptr)0x126;
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x126);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (cVar4._M_node !=
      (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    __position._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar4._M_node);
    if (Offset < (ulong)((long)&(__position._M_node[1]._M_parent)->_M_color +
                        *(long *)(__position._M_node + 1))) {
      FormatString<char[26],char[56]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Offset >= PrevBlockIt->first + PrevBlockIt->second.Size",
                 (char (*) [56])in_RCX);
      in_RCX = (_Base_ptr)0x12c;
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      in_RCX = *(_Base_ptr *)(__position._M_node + 1);
      if ((char *)((long)&(__position._M_node[1]._M_parent)->_M_color + (long)&in_RCX->_M_color) ==
          (char *)Offset) {
        Size_00 = (long)&(__position._M_node[1]._M_parent)->_M_color + Size;
        local_38 = in_RCX;
        if (((_Rb_tree_header *)cVar4._M_node == p_Var1) ||
           (Offset + Size != *(long *)(cVar4._M_node + 1))) {
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
          ::_M_erase_aux(&(this->m_FreeBlocksBySize)._M_t,__position._M_node[1]._M_left);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
          ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                          *)this,__position);
          Offset = (OffsetType)local_38;
        }
        else {
          p_Var6 = cVar4._M_node[1]._M_parent;
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
          ::_M_erase_aux(&(this->m_FreeBlocksBySize)._M_t,__position._M_node[1]._M_left);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
          ::_M_erase_aux(&(this->m_FreeBlocksBySize)._M_t,cVar4._M_node[1]._M_left);
          cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
          ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                          *)this,__position,cVar4);
          Size_00 = (long)&p_Var6->_M_color + Size_00;
          Offset = (OffsetType)local_38;
        }
        goto LAB_002522f5;
      }
    }
  }
  Size_00 = Size;
  if (((_Rb_tree_header *)cVar4._M_node != p_Var1) &&
     (Size + Offset == *(long *)(cVar4._M_node + 1))) {
    p_Var6 = cVar4._M_node[1]._M_parent;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
    ::_M_erase_aux(&(this->m_FreeBlocksBySize)._M_t,cVar4._M_node[1]._M_left);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
    ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                    *)this,cVar4);
    Size_00 = (long)&p_Var6->_M_color + Size;
  }
LAB_002522f5:
  AddNewBlock(this,Offset,Size_00);
  p_Var6 = (_Base_ptr)(Size + this->m_FreeSize);
  this->m_FreeSize = (OffsetType)p_Var6;
  if (p_Var6 == (_Base_ptr)this->m_MaxSize) {
    if ((this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
      FormatString<char[26],char[24]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GetNumFreeBlocks() == 1",(char (*) [24])in_RCX);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x16d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Base_ptr)this->m_MaxSize;
    }
    p_Var5 = (_Base_ptr)0x1;
    do {
      in_RCX = p_Var5;
      p_Var5 = (_Base_ptr)((long)in_RCX * 2);
    } while ((_Base_ptr)((long)in_RCX * 2) <= p_Var6);
    this->m_CurrAlignment = (OffsetType)in_RCX;
  }
  if ((this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    FormatString<char[26],char[57]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",
               (char (*) [57])in_RCX);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x172);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_DbgDisableDebugValidation == false) {
    DbgVerifyList(this);
  }
  return;
}

Assistant:

void Free(OffsetType Offset, OffsetType Size)
    {
        VERIFY_EXPR(Offset != Allocation::InvalidOffset && Offset + Size <= m_MaxSize);

        // Find the first element whose offset is greater than the specified offset.
        // upper_bound() returns an iterator pointing to the first element in the
        // container whose key is considered to go after k.
        auto NextBlockIt = m_FreeBlocksByOffset.upper_bound(Offset);
#ifdef DILIGENT_DEBUG
        {
            auto LowBnd = m_FreeBlocksByOffset.lower_bound(Offset); // First element whose offset is  >=
            // Since zero-size allocations are not allowed, lower bound must always be equal to the upper bound
            VERIFY_EXPR(LowBnd == NextBlockIt);
        }
#endif
        // Block being deallocated must not overlap with the next block
        VERIFY_EXPR(NextBlockIt == m_FreeBlocksByOffset.end() || Offset + Size <= NextBlockIt->first);
        auto PrevBlockIt = NextBlockIt;
        if (PrevBlockIt != m_FreeBlocksByOffset.begin())
        {
            --PrevBlockIt;
            // Block being deallocated must not overlap with the previous block
            VERIFY_EXPR(Offset >= PrevBlockIt->first + PrevBlockIt->second.Size);
        }
        else
            PrevBlockIt = m_FreeBlocksByOffset.end();

        OffsetType NewSize, NewOffset;
        if (PrevBlockIt != m_FreeBlocksByOffset.end() && Offset == PrevBlockIt->first + PrevBlockIt->second.Size)
        {
            //  PrevBlock.Offset             Offset
            //       |                          |
            //       |<-----PrevBlock.Size----->|<------Size-------->|
            //
            NewSize   = PrevBlockIt->second.Size + Size;
            NewOffset = PrevBlockIt->first;

            if (NextBlockIt != m_FreeBlocksByOffset.end() && Offset + Size == NextBlockIt->first)
            {
                //   PrevBlock.Offset           Offset            NextBlock.Offset
                //     |                          |                    |
                //     |<-----PrevBlock.Size----->|<------Size-------->|<-----NextBlock.Size----->|
                //
                NewSize += NextBlockIt->second.Size;
                m_FreeBlocksBySize.erase(PrevBlockIt->second.OrderBySizeIt);
                m_FreeBlocksBySize.erase(NextBlockIt->second.OrderBySizeIt);
                // Delete the range of two blocks
                ++NextBlockIt;
                m_FreeBlocksByOffset.erase(PrevBlockIt, NextBlockIt);
            }
            else
            {
                //   PrevBlock.Offset           Offset                     NextBlock.Offset
                //     |                          |                             |
                //     |<-----PrevBlock.Size----->|<------Size-------->| ~ ~ ~  |<-----NextBlock.Size----->|
                //
                m_FreeBlocksBySize.erase(PrevBlockIt->second.OrderBySizeIt);
                m_FreeBlocksByOffset.erase(PrevBlockIt);
            }
        }
        else if (NextBlockIt != m_FreeBlocksByOffset.end() && Offset + Size == NextBlockIt->first)
        {
            //   PrevBlock.Offset                   Offset            NextBlock.Offset
            //     |                                  |                    |
            //     |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->|<-----NextBlock.Size----->|
            //
            NewSize   = Size + NextBlockIt->second.Size;
            NewOffset = Offset;
            m_FreeBlocksBySize.erase(NextBlockIt->second.OrderBySizeIt);
            m_FreeBlocksByOffset.erase(NextBlockIt);
        }
        else
        {
            //   PrevBlock.Offset                   Offset                     NextBlock.Offset
            //     |                                  |                            |
            //     |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->| ~ ~ ~ |<-----NextBlock.Size----->|
            //
            NewSize   = Size;
            NewOffset = Offset;
        }

        AddNewBlock(NewOffset, NewSize);

        m_FreeSize += Size;
        if (IsEmpty())
        {
            // Reset current alignment
            VERIFY_EXPR(GetNumFreeBlocks() == 1);
            ResetCurrAlignment();
        }

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        if (!m_DbgDisableDebugValidation)
            DbgVerifyList();
#endif
    }